

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::DefaultReadCordTest_ReadLargeCordAfterBackup_Test::TestBody
          (DefaultReadCordTest_ReadLargeCordAfterBackup_Test *this)

{
  bool bVar1;
  int iVar2;
  void *data;
  char *pcVar3;
  char *in_R9;
  string_view src;
  AssertHelper local_1e8;
  Message local_1e0;
  allocator local_1d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_180;
  Message local_178;
  bool local_169;
  undefined1 local_168 [8];
  AssertionResult gtest_ar__2;
  Message local_150;
  undefined1 local_148 [8];
  AssertionResult gtest_ar;
  undefined1 local_128 [8];
  Cord expected;
  AssertHelper local_f8;
  Message local_f0;
  bool local_e1;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_b0;
  Message local_a8;
  bool local_99;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_;
  char *pcStack_80;
  int size;
  void *buffer;
  ArrayInputStream input;
  Cord dest;
  int i;
  allocator<char> local_31;
  string local_30 [8];
  string source;
  DefaultReadCordTest_ReadLargeCordAfterBackup_Test *this_local;
  
  source.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30,"abcdefghijk",&local_31);
  std::allocator<char>::~allocator(&local_31);
  for (dest.contents_.data_.rep_.field_0._8_4_ = 0;
      (int)dest.contents_.data_.rep_.field_0._8_4_ < 0x400;
      dest.contents_.data_.rep_.field_0._8_4_ = dest.contents_.data_.rep_.field_0._8_4_ + 1) {
    std::__cxx11::string::append((char *)local_30);
  }
  absl::lts_20250127::Cord::Cord((Cord *)&input.position_);
  data = (void *)std::__cxx11::string::data();
  iVar2 = std::__cxx11::string::size();
  ArrayInputStream::ArrayInputStream((ArrayInputStream *)&buffer,data,iVar2,-1);
  local_99 = ArrayInputStream::Next
                       ((ArrayInputStream *)&buffer,&stack0xffffffffffffff80,
                        (int *)((long)&gtest_ar_.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               + 4));
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_98,&local_99,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_98,
               (AssertionResult *)"input.Next(&buffer, &size)","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
               ,0x2fe,pcVar3);
    testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  ArrayInputStream::BackUp
            ((ArrayInputStream *)&buffer,
             gtest_ar_.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl._4_4_ + -1);
  iVar2 = std::__cxx11::string::size();
  local_e1 = ZeroCopyInputStream::ReadCord
                       ((ZeroCopyInputStream *)&buffer,(Cord *)&input.position_,iVar2 + -2);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_e0,&local_e1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)((long)&expected.contents_.data_.rep_.field_0 + 8),(internal *)local_e0,
               (AssertionResult *)"input.ReadCord(&dest, source.size() - 2)","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
               ,0x301,pcVar3);
    testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    std::__cxx11::string::~string((string *)(expected.contents_.data_.rep_.field_0.data + 8));
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  src = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_30);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )src._M_len;
  absl::lts_20250127::Cord::Cord((Cord *)local_128,src);
  absl::lts_20250127::Cord::RemovePrefix((Cord *)local_128,1);
  absl::lts_20250127::Cord::RemoveSuffix((Cord *)local_128,1);
  testing::internal::EqHelper::Compare<absl::lts_20250127::Cord,_absl::lts_20250127::Cord,_nullptr>
            ((EqHelper *)local_148,"expected","dest",(Cord *)local_128,(Cord *)&input.position_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(&local_150);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
               ,0x307,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  local_169 = ArrayInputStream::Next
                        ((ArrayInputStream *)&buffer,&stack0xffffffffffffff80,
                         (int *)((long)&gtest_ar_.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                + 4));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_168,&local_169,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(&local_178);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_168,
               (AssertionResult *)"input.Next(&buffer, &size)","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
               ,0x309,pcVar3);
    testing::internal::AssertHelper::operator=(&local_180,&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1d0,pcStack_80,
             (long)gtest_ar_.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl._4_4_,&local_1d1);
  testing::internal::EqHelper::
  Compare<char[2],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_1b0,"\"k\"",
             "std::string(reinterpret_cast<const char*>(buffer), size)",(char (*) [2])0x212f66f,
             &local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar1) {
    testing::Message::Message(&local_1e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
               ,0x30a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1e8,&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    testing::Message::~Message(&local_1e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  absl::lts_20250127::Cord::~Cord((Cord *)local_128);
  ArrayInputStream::~ArrayInputStream((ArrayInputStream *)&buffer);
  absl::lts_20250127::Cord::~Cord((Cord *)&input.position_);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

TEST(DefaultReadCordTest, ReadLargeCordAfterBackup) {
  std::string source = "abcdefghijk";
  for (int i = 0; i < 1024; i++) {
    source.append("abcdefghijk");
  }

  absl::Cord dest;
  ArrayInputStream input(source.data(), source.size());

  const void* buffer;
  int size;
  EXPECT_TRUE(input.Next(&buffer, &size));
  input.BackUp(size - 1);

  EXPECT_TRUE(input.ReadCord(&dest, source.size() - 2));

  absl::Cord expected(source);
  expected.RemovePrefix(1);
  expected.RemoveSuffix(1);

  EXPECT_EQ(expected, dest);

  EXPECT_TRUE(input.Next(&buffer, &size));
  EXPECT_EQ("k", std::string(reinterpret_cast<const char*>(buffer), size));
}